

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningHeuristics.cpp
# Opt level: O0

bool __thiscall
InliningHeuristics::BackendInlineIntoInliner
          (InliningHeuristics *this,FunctionJITTimeInfo *inlinee,Func *inliner,Func *topFunction,
          ProfileId callSiteId,bool isConstructorCall,bool isFixedMethodCall,
          bool isCallOutsideLoopInTopFunc,bool isCallInsideLoop,uint recursiveInlineDepth,
          uint16 constantArguments)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint16 uVar4;
  uint16 uVar5;
  uint uVar6;
  uint uVar7;
  JITTimeFunctionBody *pJVar8;
  intptr_t iVar9;
  intptr_t iVar10;
  char16 *pcVar11;
  char16 *pcVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  char16 *pcVar15;
  char16 *pcVar16;
  JITTimeProfileInfo *this_00;
  JITTimeWorkItem *this_01;
  FunctionJITTimeInfo *this_02;
  undefined4 *puVar17;
  bool tryAggressive;
  undefined8 in_stack_fffffffffffffda0;
  undefined4 uVar18;
  byte local_16a;
  byte scale;
  bool doConstantArgumentInlining;
  JITTimeProfileInfo *dynamicProfile;
  wchar local_158 [3];
  bool doBackEndAggressiveInline;
  char16 debugStringBuffer3 [42];
  wchar local_f8 [4];
  char16 debugStringBuffer2 [42];
  wchar local_98 [4];
  char16 debugStringBuffer [42];
  bool isCallInsideLoop_local;
  bool isCallOutsideLoopInTopFunc_local;
  bool isFixedMethodCall_local;
  bool isConstructorCall_local;
  ProfileId callSiteId_local;
  Func *topFunction_local;
  Func *inliner_local;
  FunctionJITTimeInfo *inlinee_local;
  InliningHeuristics *this_local;
  
  uVar18 = (undefined4)((ulong)in_stack_fffffffffffffda0 >> 0x20);
  pJVar8 = FunctionJITTimeInfo::GetBody(inlinee);
  uVar4 = JITTimeFunctionBody::GetArgUsedForBranch(pJVar8);
  tryAggressive = (constantArguments & uVar4) != 0;
  uVar6 = Func::GetSourceContextId(inliner);
  uVar7 = Func::GetLocalFunctionId(inliner);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlineRecursivePhase,uVar6,uVar7);
  if (!bVar3) {
    pJVar8 = FunctionJITTimeInfo::GetBody(inlinee);
    iVar9 = JITTimeFunctionBody::GetAddr(pJVar8);
    pJVar8 = Func::GetJITFunctionBody(inliner);
    iVar10 = JITTimeFunctionBody::GetAddr(pJVar8);
    if (iVar9 == iVar10) {
      pJVar8 = FunctionJITTimeInfo::GetBody(inlinee);
      bVar3 = JITTimeFunctionBody::CanInlineRecursively(pJVar8,recursiveInlineDepth,tryAggressive);
      if (!bVar3) {
        uVar6 = FunctionJITTimeInfo::GetSourceContextId(this->topFunc);
        uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(this->topFunc);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,uVar7);
        if (bVar3) {
          pJVar8 = FunctionJITTimeInfo::GetBody(inlinee);
          pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar8);
          pcVar12 = FunctionJITTimeInfo::GetDebugNumberSet(inlinee,(wchar (*) [42])local_98);
          pJVar8 = Func::GetJITFunctionBody(inliner);
          pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar8);
          pcVar14 = Func::GetDebugNumberSet(inliner,(wchar (*) [42])local_f8);
          pJVar8 = FunctionJITTimeInfo::GetBody(this->topFunc);
          pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar8);
          pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet(this->topFunc,(wchar (*) [42])local_158);
          Output::Print(L"INLINING: Skip Inline (backend): Recursive inlining\tInlinee: %s (#%s)\tCaller: %s (#%s) \tRoot: %s (#%s) Depth: %d\n"
                        ,pcVar11,pcVar12,pcVar13,pcVar14,pcVar15,pcVar16,
                        CONCAT44(uVar18,recursiveInlineDepth));
          Output::Flush();
        }
        return false;
      }
    }
  }
  bVar3 = FunctionJITTimeInfo::IsJsBuiltInForceInline(inlinee);
  if (!bVar3) {
    uVar6 = FunctionJITTimeInfo::GetSourceContextId(this->topFunc);
    uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(this->topFunc);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,InlinePhase,uVar6,uVar7);
    if (!bVar3) {
      uVar6 = Func::GetSourceContextId(inliner);
      uVar7 = Func::GetLocalFunctionId(inliner);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,InlinePhase,uVar6,uVar7);
      if (!bVar3) {
        uVar6 = FunctionJITTimeInfo::GetSourceContextId(inlinee);
        uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(inlinee);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,InlinePhase,uVar6,uVar7);
        if (!bVar3) {
          uVar6 = FunctionJITTimeInfo::GetSourceContextId(this->topFunc);
          uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(this->topFunc);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,InlineTreePhase,uVar6,uVar7);
          if (!bVar3) {
            uVar6 = Func::GetSourceContextId(inliner);
            uVar7 = Func::GetLocalFunctionId(inliner);
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,InlineTreePhase,uVar6,uVar7);
            if (!bVar3) {
              uVar6 = FunctionJITTimeInfo::GetSourceContextId(inlinee);
              uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(inlinee);
              bVar3 = Js::Phases::IsEnabled
                                ((Phases *)&DAT_01ea41a0,InlineAtEveryCallerPhase,uVar6,uVar7);
              if (bVar3) {
                return true;
              }
              this_00 = Func::GetReadOnlyProfileInfo(inliner);
              bVar3 = false;
              if (this_00 != (JITTimeProfileInfo *)0x0) {
                uVar4 = JITTimeProfileInfo::GetConstantArgInfo(this_00,callSiteId);
                pJVar8 = FunctionJITTimeInfo::GetBody(inlinee);
                uVar5 = JITTimeFunctionBody::GetArgUsedForBranch(pJVar8);
                bVar3 = (uVar4 & uVar5) != 0;
              }
              if (bVar3) {
                pJVar8 = FunctionJITTimeInfo::GetBody(inlinee);
                uVar6 = JITTimeFunctionBody::GetNonLoadByteCodeCount(pJVar8);
                if (uVar6 < (uint)(this->threshold).constantArgumentInlineThreshold) {
                  return true;
                }
              }
              this_01 = Func::GetWorkItem(topFunction);
              this_02 = JITTimeWorkItem::GetJITTimeInfo(this_01);
              bVar3 = FunctionJITTimeInfo::IsAggressiveInliningEnabled(this_02);
              if (bVar3) {
                return true;
              }
              if (isConstructorCall) {
                return true;
              }
              if ((isCallInsideLoop) && (bVar3 = IsInlineeLeaf(inlinee), bVar3)) {
                return true;
              }
              if (isCallInsideLoop) {
                pJVar8 = FunctionJITTimeInfo::GetBody(inlinee);
                bVar3 = JITTimeFunctionBody::HasLoops(pJVar8);
                if (bVar3) {
                  uVar6 = FunctionJITTimeInfo::GetSourceContextId(this->topFunc);
                  uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(this->topFunc);
                  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,uVar7);
                  if (bVar3) {
                    pJVar8 = FunctionJITTimeInfo::GetBody(inlinee);
                    pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar8);
                    pcVar12 = FunctionJITTimeInfo::GetDebugNumberSet
                                        (inlinee,(wchar (*) [42])local_98);
                    pJVar8 = Func::GetJITFunctionBody(inliner);
                    pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar8);
                    pcVar14 = Func::GetDebugNumberSet(inliner,(wchar (*) [42])local_f8);
                    pJVar8 = FunctionJITTimeInfo::GetBody(this->topFunc);
                    pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar8);
                    pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet
                                        (this->topFunc,(wchar (*) [42])local_158);
                    Output::Print(L"INLINING: Skip Inline (backend): Recursive loop inlining\tInlinee: %s (#%s)\tCaller: %s (#%s) \tRoot: %s (#%s)\n"
                                  ,pcVar11,pcVar12,pcVar13,pcVar14,pcVar15,pcVar16);
                    Output::Flush();
                  }
                  return false;
                }
              }
              local_16a = 1;
              if (tryAggressive) {
                local_16a = 2;
              }
              if (!isCallOutsideLoopInTopFunc) {
                return true;
              }
              if (-1 < (this->threshold).outsideLoopInlineThreshold) {
                pJVar8 = FunctionJITTimeInfo::GetBody(inlinee);
                uVar6 = JITTimeFunctionBody::GetNonLoadByteCodeCount(pJVar8);
                if (uVar6 <= (this->threshold).outsideLoopInlineThreshold * (uint)local_16a) {
                  return true;
                }
              }
              if (isCallInsideLoop) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar17 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningHeuristics.cpp"
                                   ,0xb4,"(!isCallInsideLoop)","!isCallInsideLoop");
                if (!bVar3) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar17 = 0;
              }
              uVar6 = FunctionJITTimeInfo::GetSourceContextId(this->topFunc);
              uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(this->topFunc);
              bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,uVar7);
              if (bVar3) {
                uVar1 = (this->threshold).outsideLoopInlineThreshold;
                pJVar8 = FunctionJITTimeInfo::GetBody(inlinee);
                uVar6 = JITTimeFunctionBody::GetByteCodeCount(pJVar8);
                pJVar8 = FunctionJITTimeInfo::GetBody(inlinee);
                pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar8);
                pcVar12 = FunctionJITTimeInfo::GetDebugNumberSet(inlinee,(wchar (*) [42])local_98);
                pJVar8 = Func::GetJITFunctionBody(inliner);
                pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar8);
                pcVar14 = Func::GetDebugNumberSet(inliner,(wchar (*) [42])local_f8);
                pJVar8 = FunctionJITTimeInfo::GetBody(this->topFunc);
                pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar8);
                pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet
                                    (this->topFunc,(wchar (*) [42])local_158);
                Output::Print(L"INLINING: Skip Inline (backend): Inlining outside loop doesn\'t meet OutsideLoopInlineThreshold: %d \tBytecode size: %d\tInlinee: %s (#%s)\tCaller: %s (#%s) \tRoot: %s (#%s)\n"
                              ,(ulong)uVar1,(ulong)uVar6,pcVar11,pcVar12,pcVar13,pcVar14,pcVar15,
                              pcVar16);
                Output::Flush();
              }
              return false;
            }
          }
          return true;
        }
      }
    }
  }
  return true;
}

Assistant:

bool InliningHeuristics::BackendInlineIntoInliner(const FunctionJITTimeInfo * inlinee,
                                Func * inliner,
                                Func *topFunction,
                                Js::ProfileId callSiteId,
                                bool isConstructorCall,
                                bool isFixedMethodCall,                     // Reserved
                                bool isCallOutsideLoopInTopFunc,            // There is a loop for sure and this call is outside loop
                                bool isCallInsideLoop,
                                uint recursiveInlineDepth,
                                uint16 constantArguments
                                )
{
    // We have one piece of additional data in backend, whether  we are outside loop or inside
    // This function decides to inline or not based on that additional data. Most of the filtering is already done by DeciderInlineIntoInliner which is called
    // during work item creation.
    // This is additional filtering during actual inlining phase.

    // Note *order* is important
    // Following are
    // 1. Constructor is always inlined (irrespective of inside or outside)
    // 2. If the inlinee candidate has constant argument and that argument is used for a branch and the inlinee size is within ConstantArgumentInlineThreshold(157) we inline
    // 3. Inside loops:
    //     3a. Leaf function will always get inlined (irrespective of leaf has loop or not)
    //     3b. If the inlinee has loops, don't inline it (Basically avoiding inlining a loop within another loop unless its leaf).
    // 4. Outside loop (inliner has loops):
    //     4a. Only inline small inlinees. Governed by OutsideLoopInlineThreshold (16)
    // 5. Rest are inlined.
#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer3[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    // TODO: OOP JIT, somehow need to track across functions
    bool doBackEndAggressiveInline = (constantArguments & inlinee->GetBody()->GetArgUsedForBranch()) != 0;

    if (!PHASE_OFF(Js::InlineRecursivePhase, inliner)
        && inlinee->GetBody()->GetAddr() == inliner->GetJITFunctionBody()->GetAddr()
        && (!inlinee->GetBody()->CanInlineRecursively(recursiveInlineDepth, doBackEndAggressiveInline)))
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline (backend): Recursive inlining\tInlinee: %s (#%s)\tCaller: %s (#%s) \tRoot: %s (#%s) Depth: %d\n"),
            inlinee->GetBody()->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
            inliner->GetJITFunctionBody()->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
            topFunc->GetBody()->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3),
            recursiveInlineDepth);
        return false;
    }

    if(inlinee->IsJsBuiltInForceInline() ||
        PHASE_FORCE(Js::InlinePhase, this->topFunc) ||
        PHASE_FORCE(Js::InlinePhase, inliner) ||
        PHASE_FORCE(Js::InlinePhase, inlinee))
    {
        return true;
    }

    if (PHASE_FORCE(Js::InlineTreePhase, this->topFunc) ||
        PHASE_FORCE(Js::InlineTreePhase, inliner))
    {
        return true;
    }

    if (PHASE_FORCE(Js::InlineAtEveryCallerPhase, inlinee))
    {
        return true;
    }

    const JITTimeProfileInfo *dynamicProfile = inliner->GetReadOnlyProfileInfo();

    bool doConstantArgumentInlining = (dynamicProfile && dynamicProfile->GetConstantArgInfo(callSiteId) & inlinee->GetBody()->GetArgUsedForBranch()) != 0;
    if (doConstantArgumentInlining && inlinee->GetBody()->GetNonLoadByteCodeCount() <  (uint)threshold.constantArgumentInlineThreshold)
    {
        return true;
    }


    if (topFunction->GetWorkItem()->GetJITTimeInfo()->IsAggressiveInliningEnabled())
    {
        return true;
    }

    if (isConstructorCall)
    {
        return true;
    }


    if (isCallInsideLoop && IsInlineeLeaf(inlinee))
    {
        return true;
    }

    if (isCallInsideLoop && inlinee->GetBody()->HasLoops() )                            // Don't inline function with loops inside another loop unless it is a leaf
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline (backend): Recursive loop inlining\tInlinee: %s (#%s)\tCaller: %s (#%s) \tRoot: %s (#%s)\n"),
            inlinee->GetBody()->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
            inliner->GetJITFunctionBody()->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
            topFunc->GetBody()->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3));
        return false;
    }
    byte scale = 1;

    if (doBackEndAggressiveInline)
    {
        scale = 2;
    }

    if (isCallOutsideLoopInTopFunc &&
        (threshold.outsideLoopInlineThreshold < 0 ||
        inlinee->GetBody()->GetNonLoadByteCodeCount() > (uint)threshold.outsideLoopInlineThreshold * scale))
    {
        Assert(!isCallInsideLoop);
        INLINE_TESTTRACE(_u("INLINING: Skip Inline (backend): Inlining outside loop doesn't meet OutsideLoopInlineThreshold: %d \tBytecode size: %d\tInlinee: %s (#%s)\tCaller: %s (#%s) \tRoot: %s (#%s)\n"),
            threshold.outsideLoopInlineThreshold,
            inlinee->GetBody()->GetByteCodeCount(),
            inlinee->GetBody()->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
            inliner->GetJITFunctionBody()->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
            topFunc->GetBody()->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3));
        return false;
    }
    return true;
}